

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void iremga20_alloc_rom(void *info,UINT32 memsize)

{
  void *pvVar1;
  ga20_state *chip;
  UINT32 memsize_local;
  void *info_local;
  
  if (*(UINT32 *)((long)info + 0x10) != memsize) {
    pvVar1 = realloc(*(void **)((long)info + 8),(ulong)memsize);
    *(void **)((long)info + 8) = pvVar1;
    *(UINT32 *)((long)info + 0x10) = memsize;
    memset(*(void **)((long)info + 8),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void iremga20_alloc_rom(void* info, UINT32 memsize)
{
	ga20_state *chip = (ga20_state *)info;
	
	if (chip->rom_size == memsize)
		return;
	
	chip->rom = (UINT8*)realloc(chip->rom, memsize);
	chip->rom_size = memsize;
	memset(chip->rom, 0xFF, memsize);
	
	return;
}